

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopUtils::PartiallyUnroll(LoopUtils *this,size_t factor)

{
  BasicBlock *parent_block;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> loop;
  size_t factor_00;
  pointer this_00;
  IRContext *pIVar1;
  pointer ppBVar2;
  bool bVar3;
  uint32_t uVar4;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_01;
  __uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
  this_02;
  BasicBlock *basic_block;
  mapped_type *ppBVar5;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  int64_t iVar8;
  Instruction *pIVar9;
  LoopDescriptor *this_03;
  ulong uVar10;
  __node_base *p_Var11;
  pointer ppBVar12;
  Loop *pLVar13;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> new_loop;
  uint32_t local_2ac;
  Loop *local_2a8;
  uint32_t local_29c;
  size_t local_298;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_exit_bb
  ;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> new_block_order;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_240;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> new_inductions
  ;
  InstructionBuilder builder;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> old_inductions
  ;
  LoopUnrollerUtilsImpl unroller;
  
  if ((factor == 1) || (bVar3 = CanPerformUnroll(this), !bVar3)) {
    return false;
  }
  unroller.context_ = this->context_;
  pLVar13 = this->loop_;
  unroller.function_ = pLVar13->loop_header_->function_;
  memset(&unroller.blocks_to_add_,0,0x98);
  unroller.state_.new_blocks._M_h._M_bucket_count = 1;
  unroller.state_.new_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unroller.state_.new_blocks._M_h._M_element_count = 0;
  unroller.state_.new_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unroller.state_.new_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  unroller.state_.new_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unroller.state_.new_inst._M_h._M_buckets = &unroller.state_.new_inst._M_h._M_single_bucket;
  unroller.state_.new_inst._M_h._M_bucket_count = 1;
  unroller.state_.new_inst._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unroller.state_.new_inst._M_h._M_element_count = 0;
  unroller.state_.new_inst._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unroller.state_.new_inst._M_h._M_rehash_policy._M_next_resize = 0;
  unroller.state_.new_inst._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unroller.state_.ids_to_new_inst._M_h._M_buckets =
       &unroller.state_.ids_to_new_inst._M_h._M_single_bucket;
  unroller.state_.ids_to_new_inst._M_h._M_bucket_count = 1;
  unroller.state_.ids_to_new_inst._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unroller.state_.ids_to_new_inst._M_h._M_element_count = 0;
  unroller.state_.ids_to_new_inst._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unroller.state_.ids_to_new_inst._M_h._M_rehash_policy._M_next_resize = 0;
  unroller.state_.ids_to_new_inst._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unroller.loop_blocks_inorder_.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unroller.loop_blocks_inorder_.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unroller.loop_blocks_inorder_.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unroller.loop_condition_block_ = (BasicBlock *)0x0;
  unroller.loop_induction_variable_ = (Instruction *)0x0;
  unroller.loop_phi_instructions_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unroller.loop_phi_instructions_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unroller.loop_phi_instructions_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unroller.number_of_loop_iterations_ = 0;
  unroller.loop_step_value_ = 0;
  unroller.loop_init_value_ = 0;
  unroller.state_.new_blocks._M_h._M_buckets = &unroller.state_.new_blocks._M_h._M_single_bucket;
  anon_unknown_0::LoopUnrollerUtilsImpl::Init(&unroller,pLVar13);
  if (factor < unroller.number_of_loop_iterations_) {
    pLVar13 = this->loop_;
    if (unroller.number_of_loop_iterations_ % factor == 0) {
      anon_unknown_0::LoopUnrollerUtilsImpl::Unroll(&unroller,pLVar13,factor);
      anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart(&unroller,pLVar13);
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop(&unroller,pLVar13);
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction(&unroller,pLVar13->loop_merge_);
      anon_unknown_0::LoopUnrollerUtilsImpl::RemoveDeadInstructions(&unroller);
    }
    else {
      local_298 = factor;
      this_01.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )operator_new(0x70);
      pIVar1 = unroller.context_;
      uVar4 = IRContext::TakeNextId(unroller.context_);
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Instruction::Instruction
                ((Instruction *)
                 this_01.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar1,
                 OpLabel,0,uVar4,(OperandList *)&new_block_order);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &new_block_order);
      this_02.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            )operator_new(0x88);
      local_240._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           this_01.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      BasicBlock::BasicBlock
                ((BasicBlock *)
                 this_02.
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_240);
      new_exit_bb._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )this_02.
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           )local_240._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
          (Instruction *)0x0) {
        (**(code **)(*(long *)local_240._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 8))();
      }
      local_240._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )0x0;
      p_Var11 = &unroller.state_.new_blocks._M_h._M_before_begin;
      *(Function **)
       this_02.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = unroller.function_;
      local_29c = BasicBlock::id((BasicBlock *)
                                 this_02.
                                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                 _M_head_impl);
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                  *)&unroller.blocks_to_add_,&new_exit_bb);
      parent_block = ((unroller.blocks_to_add_.
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      BasicBlock::tail((BasicBlock *)&new_block_order);
      this_00 = new_block_order.
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2a8 = pLVar13;
      MakeUnique<spvtools::opt::Loop,spvtools::opt::Loop&>((spvtools *)&new_loop,pLVar13);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)new_loop._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                        .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 0x50));
      ppBVar2 = unroller.loop_blocks_inorder_.
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      loop = new_loop;
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (ppBVar12 = unroller.loop_blocks_inorder_.
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pLVar13 = local_2a8,
          ppBVar12 != ppBVar2; ppBVar12 = ppBVar12 + 1) {
        anon_unknown_0::LoopUnrollerUtilsImpl::CopyBasicBlock(&unroller,local_2a8,*ppBVar12,true);
        builder.context_ =
             (IRContext *)
             unroller.blocks_to_add_.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
        emplace_back<spvtools::opt::BasicBlock*>
                  ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
                   &new_block_order,(BasicBlock **)&builder);
      }
      basic_block = BasicBlock::Clone(local_2a8->loop_merge_,unroller.context_);
      basic_block->function_ = pLVar13->loop_merge_->function_;
      anon_unknown_0::LoopUnrollerUtilsImpl::AssignNewResultIds(&unroller,basic_block);
      uVar4 = BasicBlock::id(pLVar13->loop_merge_);
      builder.context_ = (IRContext *)CONCAT44(builder.context_._4_4_,uVar4);
      ppBVar5 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&unroller.state_.new_blocks,(key_type *)&builder);
      *ppBVar5 = basic_block;
      while( true ) {
        p_Var11 = p_Var11->_M_nxt;
        if (p_Var11 == (__node_base *)0x0) break;
        anon_unknown_0::LoopUnrollerUtilsImpl::RemapOperands
                  (&unroller,
                   *(BasicBlock **)&((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor);
      }
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      _M_move_assign(&unroller.loop_blocks_inorder_,
                     &new_block_order.
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    );
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop
                (&unroller,
                 (Loop *)loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
      *(BasicBlock **)
       ((long)loop._M_t.
              super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
              .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 8) =
           unroller.state_.new_header_block;
      Loop::SetContinueBlock
                ((Loop *)loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                 unroller.state_.new_continue_block);
      Loop::SetLatchBlock((Loop *)loop._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                  .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                          unroller.state_.new_latch_block);
      Loop::SetMergeBlock((Loop *)loop._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                  .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                          basic_block);
      std::_Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      ~_Vector_base(&new_block_order.
                     super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   );
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction(&unroller,local_2a8->loop_merge_);
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ::clear(&unroller.blocks_to_add_);
      InstructionBuilder::InstructionBuilder(&builder,unroller.context_,parent_block,kAnalysisNone);
      uVar4 = BasicBlock::id(*(BasicBlock **)
                              ((long)new_loop._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                     .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>.
                                     _M_head_impl + 8));
      InstructionBuilder::AddBranch(&builder,uVar4);
      factor_00 = local_298;
      unroller.loop_condition_block_ = unroller.state_.new_condition_block;
      unroller.loop_induction_variable_ = unroller.state_.new_phi;
      anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
                (&unroller,
                 (Loop *)new_loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,local_298
                );
      anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
                (&unroller,
                 (Loop *)new_loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop
                (&unroller,
                 (Loop *)new_loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
      new_block_order.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)new_loop._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                   .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 0x18);
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                  *)&unroller.blocks_to_add_,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)&new_block_order);
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&new_block_order);
      anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction(&unroller,local_2a8->loop_merge_);
      IRContext::InvalidateAnalysesExceptFor(unroller.context_,kAnalysisLoopAnalysis);
      pLVar13 = local_2a8;
      pDVar6 = IRContext::get_def_use_mgr(unroller.context_);
      uVar4 = Instruction::GetSingleWordOperand((Instruction *)this_00,0);
      pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
      bVar3 = Loop::IsSupportedCondition(pLVar13,pIVar7->opcode_);
      if (!bVar3) {
        __assert_fail("loop->IsSupportedCondition(condition_check->opcode())",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                      ,0x1bb,
                      "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                     );
      }
      iVar8 = Loop::GetResidualConditionValue
                        (pIVar7->opcode_,unroller.loop_init_value_,unroller.loop_step_value_,
                         unroller.number_of_loop_iterations_,factor_00);
      if (0x7ffffffe < iVar8 + 0x7fffffffU >> 1) {
        __assert_fail("remainder > std::numeric_limits<int32_t>::min() && remainder < std::numeric_limits<int32_t>::max()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                      ,0x1c3,
                      "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                     );
      }
      if (iVar8 < 0) {
        pIVar9 = InstructionBuilder::GetSintConstant(&builder,(uint32_t)iVar8);
      }
      else {
        pIVar9 = InstructionBuilder::GetUintConstant(&builder,(uint32_t)iVar8);
      }
      uVar4 = Instruction::result_id(pIVar9);
      new_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(new_inductions.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&new_inductions;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&new_block_order,init_list);
      Instruction::SetInOperand(pIVar7,1,(SmallVector<unsigned_int,_2UL> *)&new_block_order);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&new_block_order);
      new_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Loop::GetInductionVariables
                ((Loop *)new_loop._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                         .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                 &new_inductions);
      old_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      old_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      old_inductions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Loop::GetInductionVariables(pLVar13,&old_inductions);
      uVar10 = 0;
      while (uVar10 < (ulong)((long)new_inductions.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)new_inductions.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        pIVar7 = new_inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10];
        pIVar9 = old_inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10];
        local_298 = uVar10;
        uVar4 = anon_unknown_0::GetPhiIndexFromLabel
                          (*(BasicBlock **)
                            ((long)new_loop._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                   .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl
                            + 0x20),pIVar9);
        local_2ac = Instruction::result_id(pIVar9);
        init_list_00._M_len = 1;
        init_list_00._M_array = &local_2ac;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&new_block_order,init_list_00);
        Instruction::SetInOperand
                  (pIVar7,uVar4 - 1,(SmallVector<unsigned_int,_2UL> *)&new_block_order);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&new_block_order);
        local_2ac = local_29c;
        init_list_01._M_len = 1;
        init_list_01._M_array = &local_2ac;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&new_block_order,init_list_01);
        Instruction::SetInOperand(pIVar7,uVar4,(SmallVector<unsigned_int,_2UL> *)&new_block_order);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&new_block_order);
        pLVar13 = local_2a8;
        uVar4 = Instruction::result_id(pIVar7);
        pDVar6 = IRContext::get_def_use_mgr(unroller.context_);
        new_block_order.
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar13;
        new_block_order.
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)uVar4;
        new_block_order.
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp:493:40)>
                      ::_M_manager;
        analysis::DefUseManager::ForEachUse
                  (pDVar6,pIVar9,
                   (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&new_block_order);
        if (new_block_order.
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)new_block_order.
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)
                    ((SmallVector<unsigned_int,_2UL> *)&new_block_order,
                     (SmallVector<unsigned_int,_2UL> *)&new_block_order,3);
        }
        uVar10 = local_298 + 1;
      }
      IRContext::InvalidateAnalysesExceptFor(unroller.context_,kAnalysisLoopAnalysis);
      pIVar1 = unroller.context_;
      uVar4 = BasicBlock::id(pLVar13->loop_merge_);
      IRContext::ReplaceAllUsesWith(pIVar1,uVar4,local_29c);
      this_03 = IRContext::GetLoopDescriptor(unroller.context_,unroller.function_);
      LoopDescriptor::AddLoop(this_03,&new_loop,pLVar13->parent_);
      anon_unknown_0::LoopUnrollerUtilsImpl::RemoveDeadInstructions(&unroller);
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&old_inductions.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&new_inductions.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
                (&new_loop);
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr(&new_exit_bb);
    }
  }
  else {
    anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll(&unroller,this->loop_);
  }
  anon_unknown_0::LoopUnrollerUtilsImpl::~LoopUnrollerUtilsImpl(&unroller);
  return true;
}

Assistant:

bool LoopUtils::PartiallyUnroll(size_t factor) {
  if (factor == 1 || !CanPerformUnroll()) return false;

  // Create the unroller utility.
  LoopUnrollerUtilsImpl unroller{context_,
                                 loop_->GetHeaderBlock()->GetParent()};
  unroller.Init(loop_);

  // If the unrolling factor is larger than or the same size as the loop just
  // fully unroll the loop.
  if (factor >= unroller.GetLoopIterationCount()) {
    unroller.FullyUnroll(loop_);
    return true;
  }

  // If the loop unrolling factor is an residual number of iterations we need to
  // let run the loop for the residual part then let it branch into the unrolled
  // remaining part. We add one when calucating the remainder to take into
  // account the one iteration already in the loop.
  if (unroller.GetLoopIterationCount() % factor != 0) {
    unroller.PartiallyUnrollResidualFactor(loop_, factor);
  } else {
    unroller.PartiallyUnroll(loop_, factor);
  }

  return true;
}